

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_arena.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_arena_unittest::ArenaMessage::_InternalSerialize
          (ArenaMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int cached_size;
  RepeatedPtrField<proto2_arena_unittest::NestedMessage> *this_00;
  const_reference this_01;
  UnknownFieldSet *unknown_fields;
  NestedMessage *repfield;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  ArenaMessage *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  ArenaMessage *this_local;
  
  local_30 = 0;
  uVar2 = _internal_repeated_nested_message_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; local_30 < uVar2; local_30 = local_30 + 1) {
    this_00 = _internal_repeated_nested_message(this);
    this_01 = google::protobuf::RepeatedPtrField<proto2_arena_unittest::NestedMessage>::Get
                        (this_00,local_30);
    cached_size = NestedMessage::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (1,(MessageLite *)this_01,cached_size,(uint8_t *)stream_local,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL ArenaMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const ArenaMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_arena_unittest.ArenaMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .proto2_arena_unittest.NestedMessage repeated_nested_message = 1;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_nested_message_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_nested_message().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            1, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_arena_unittest.ArenaMessage)
  return target;
}